

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::BuiltinPrecisionCaseTestInstance
          (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
           *this,Context *context,CaseContext *caseCtx,ShaderSpec *shaderSpec,
          Variables<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
          *variables,
          Samplings<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,StatementP *stmt)

{
  ShaderType shaderType;
  Variables<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *shaderSpec_00;
  CaseContext *context_00;
  ShaderExecutor *pSVar1;
  DefaultDeleter<vkt::shaderexecutor::ShaderExecutor> local_51;
  VkDescriptorSetLayout local_50 [3];
  Samplings<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_38;
  Samplings<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *samplings_local;
  Variables<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *variables_local;
  ShaderSpec *shaderSpec_local;
  CaseContext *caseCtx_local;
  Context *context_local;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  local_38 = samplings;
  samplings_local =
       (Samplings<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        *)variables;
  variables_local =
       (Variables<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
        *)shaderSpec;
  shaderSpec_local = (ShaderSpec *)caseCtx;
  caseCtx_local = (CaseContext *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinPrecisionCaseTestInstance_01688388;
  CaseContext::CaseContext(&this->m_caseCtx,caseCtx);
  Variables<vkt::shaderexecutor::InTypes<float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  ::Variables(&this->m_variables,variables);
  this->m_samplings = local_38;
  StatementP::StatementP(&this->m_stmt,stmt);
  context_00 = caseCtx_local;
  shaderSpec_00 = variables_local;
  shaderType = caseCtx->shaderType;
  ::vk::Handle<(vk::HandleType)19>::Handle(local_50,0);
  pSVar1 = createExecutor((Context *)context_00,shaderType,(ShaderSpec *)shaderSpec_00,local_50[0]);
  de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>::DefaultDeleter(&local_51);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::UniquePtr(&this->m_executor,pSVar1);
  return;
}

Assistant:

BuiltinPrecisionCaseTestInstance	(Context&						context,
																		 const CaseContext				caseCtx,
																		 const ShaderSpec&				shaderSpec,
																		 const Variables<In, Out>		variables,
																		 const Samplings<In>&			samplings,
																		 const StatementP				stmt)
										: TestInstance	(context)
										, m_caseCtx		(caseCtx)
										, m_variables	(variables)
										, m_samplings	(samplings)
										, m_stmt		(stmt)
										, m_executor	(createExecutor(context, caseCtx.shaderType, shaderSpec))
									{
									}